

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_lcp_2way_parallel<false>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,size_t n)

{
  uchar **strings_input_00;
  uchar **strings_output_00;
  lcp_t *lcp_output_00;
  MergeResult MVar1;
  MergeResult MVar2;
  ostream *poVar3;
  size_t n_00;
  ulong n_01;
  lcp_t *in_stack_ffffffffffffff90;
  char local_61;
  lcp_t *local_60;
  uchar **local_58;
  uchar **local_50;
  size_t local_48;
  lcp_t *local_40;
  lcp_t *local_38;
  
  if (n == 0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x121,
                  "MergeResult mergesort_lcp_2way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                 );
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"mergesort_lcp_2way_parallel",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(): n=",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_61 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_61,1);
  if (n < 0x10000) {
    MVar1 = mergesort_lcp_2way<true>(strings_input,strings_output,lcp_input,lcp_output,n);
  }
  else {
    n_01 = n >> 1;
    MVar1 = mergesort_lcp_2way_parallel<true>
                      (strings_input,strings_output,lcp_input,lcp_output,n_01);
    strings_input_00 = strings_input + n_01;
    strings_output_00 = strings_output + n_01;
    local_60 = lcp_input + n_01;
    lcp_output_00 = lcp_output + n_01;
    n_00 = n - n_01;
    local_58 = strings_input;
    local_50 = strings_output;
    local_40 = lcp_input;
    local_38 = lcp_output;
    MVar2 = mergesort_lcp_2way_parallel<true>
                      (strings_input_00,strings_output_00,local_60,lcp_output_00,n_00);
    if (MVar1 != MVar2) {
      if (MVar1 != SortedInPlace) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x13c,
                      "MergeResult mergesort_lcp_2way_parallel(unsigned char **__restrict, unsigned char **__restrict, lcp_t *__restrict, lcp_t *__restrict, size_t) [OutputLCP = false]"
                     );
      }
      local_48 = n_00 * 8;
      memcpy(strings_input_00,strings_output_00,local_48);
      memcpy(local_60,lcp_output_00,local_48);
    }
    if (MVar1 == SortedInPlace) {
      merge_lcp_2way<false>
                (local_58,local_40,n_01,strings_input_00,local_60,n_00,local_50,
                 in_stack_ffffffffffffff90);
      MVar1 = SortedInTemp;
    }
    else {
      merge_lcp_2way<false>
                (local_50,local_38,n_01,strings_output_00,lcp_output_00,n_00,local_58,
                 in_stack_ffffffffffffff90);
      MVar1 = SortedInPlace;
    }
  }
  return MVar1;
}

Assistant:

MergeResult
mergesort_lcp_2way_parallel(
		unsigned char** restrict strings_input,
		unsigned char** restrict strings_output,
		lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
		size_t n)
{
	assert(n > 0);
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 0x10000)
		return mergesort_lcp_2way<true>(
				strings_input, strings_output,
				lcp_input, lcp_output, n);
	const size_t split0 = n/2;
	MergeResult ml, mr;
#pragma omp task shared(ml)
	ml = mergesort_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input,     lcp_output,
			split0);
#pragma omp task shared(mr)
	mr = mergesort_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0,     lcp_output+split0,
			n-split0);
#pragma omp taskwait
	if (ml != mr) {
		if (ml == SortedInPlace) {
			std::copy(strings_output+split0, strings_output+n,
					strings_input+split0);
			std::copy(lcp_output+split0, lcp_output+n,
					lcp_input+split0);
			mr = SortedInPlace;
		} else {
			assert(0);
			abort();
		}
	}
	if (ml == SortedInPlace) {
		merge_lcp_2way<OutputLCP>(
		           strings_input,        lcp_input,        split0,
		           strings_input+split0, lcp_input+split0, n-split0,
		           strings_output, lcp_output);
		return SortedInTemp;
	} else {
		merge_lcp_2way<OutputLCP>(
		           strings_output,        lcp_output,        split0,
		           strings_output+split0, lcp_output+split0, n-split0,
		           strings_input, lcp_input);
		return SortedInPlace;
	}
}